

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

time_t mg_mgr_poll(mg_mgr *mgr,int milli)

{
  ulong uVar1;
  uint __i;
  uint uVar2;
  int iVar3;
  long lVar4;
  ssize_t sVar5;
  mg_connection *pmVar6;
  mg_connection *pmVar7;
  double dVar8;
  sock_t max_fd;
  timeval tv;
  fd_set read_set;
  fd_set err_set;
  fd_set write_set;
  code *local_2038;
  undefined1 local_2030 [8192];
  
  dVar8 = cs_time();
  max_fd = -1;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    read_set.fds_bits[lVar4] = 0;
  }
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    write_set.fds_bits[lVar4] = 0;
  }
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    err_set.fds_bits[lVar4] = 0;
  }
  mg_add_to_set(mgr->ctl[1],&read_set,&max_fd);
  pmVar7 = mgr->active_connections;
  while (pmVar6 = pmVar7, pmVar6 != (mg_connection *)0x0) {
    pmVar7 = pmVar6->next;
    if (pmVar6->sock == -1) {
      mg_mgr_handle_conn(pmVar6,0,dVar8);
    }
    else {
      uVar1 = pmVar6->flags;
      uVar2 = (uint)uVar1;
      if ((((uVar1 & 0x40) == 0) && ((pmVar6->recv_mbuf).len < pmVar6->recv_mbuf_limit)) &&
         (((uVar1 & 2) == 0 || (pmVar6->listener == (mg_connection *)0x0)))) {
        mg_add_to_set(pmVar6->sock,&read_set,&max_fd);
        uVar2 = (uint)pmVar6->flags;
      }
      if (((uVar2 & 0x28) == 8) || (((uVar2 & 8) == 0 && ((pmVar6->send_mbuf).len != 0)))) {
        mg_add_to_set(pmVar6->sock,&write_set,&max_fd);
        mg_add_to_set(pmVar6->sock,&err_set,&max_fd);
      }
    }
  }
  tv.tv_sec = (__time_t)(milli / 1000);
  tv.tv_usec = (__suseconds_t)((milli % 1000) * 1000);
  uVar2 = select(max_fd + 1,(fd_set *)&read_set,(fd_set *)&write_set,(fd_set *)&err_set,
                 (timeval *)&tv);
  dVar8 = cs_time();
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_mgr_poll");
    cs_log_printf("select @ %ld num_ev=%d of %d",(long)dVar8,(ulong)uVar2);
  }
  if (((0 < (int)uVar2) && (iVar3 = mgr->ctl[1], iVar3 != -1)) &&
     (((ulong)read_set.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0)) {
    sVar5 = recv(iVar3,&local_2038,0x2008,0);
    send(mgr->ctl[1],local_2030,1,0);
    if (LL_DEBUG < s_cs_log_level) {
      fprintf(_stderr,"%-20s ","mg_mgr_handle_ctl_sock");
      cs_log_printf("read %d from ctl socket");
    }
    if ((7 < (int)sVar5) && (pmVar7 = (mg_connection *)mgr, local_2038 != (code *)0x0)) {
      while (pmVar7 = pmVar7->next, pmVar7 != (mg_connection *)0x0) {
        (*local_2038)(pmVar7,0,local_2030);
      }
    }
  }
  pmVar7 = mgr->active_connections;
  while (pmVar7 != (mg_connection *)0x0) {
    if ((int)uVar2 < 1) {
      iVar3 = 0;
    }
    else {
      iVar3 = pmVar7->sock / 0x40;
      uVar1 = (long)pmVar7->sock % 0x40;
      iVar3 = (uint)(((ulong)read_set.fds_bits[iVar3] >> (uVar1 & 0x3f) & 1) != 0) +
              (uint)(((ulong)write_set.fds_bits[iVar3] >> (uVar1 & 0x3f) & 1) != 0) * 2 +
              (uint)(((ulong)err_set.fds_bits[iVar3] >> (uVar1 & 0x3f) & 1) != 0) * 4;
    }
    pmVar6 = pmVar7->next;
    mg_mgr_handle_conn(pmVar7,iVar3,dVar8);
    pmVar7 = pmVar6;
  }
  pmVar7 = mgr->active_connections;
  while (pmVar6 = pmVar7, pmVar6 != (mg_connection *)0x0) {
    pmVar7 = pmVar6->next;
    uVar2 = (uint)pmVar6->flags;
    if (((uVar2 >> 0xb & 1) != 0) || (((uVar2 >> 10 & 1) != 0 && ((pmVar6->send_mbuf).len == 0)))) {
      mg_close_conn(pmVar6);
    }
  }
  return (long)dVar8;
}

Assistant:

time_t mg_mgr_poll(struct mg_mgr *mgr, int milli) {
    double now = mg_time();
    struct mg_connection *nc, *tmp;
    struct timeval tv;
    fd_set read_set, write_set, err_set;
    sock_t max_fd = INVALID_SOCKET;
    int num_fds, num_selected;

    FD_ZERO(&read_set);
    FD_ZERO(&write_set);
    FD_ZERO(&err_set);
#ifndef MG_DISABLE_SOCKETPAIR
    mg_add_to_set(mgr->ctl[1], &read_set, &max_fd);
#endif

    for (nc = mgr->active_connections, num_fds = 0; nc != NULL; nc = tmp) {
        tmp = nc->next;

        if (nc->sock == INVALID_SOCKET) {
            mg_mgr_handle_conn(nc, 0, now);
            continue;
        }

        num_fds++;

        if (!(nc->flags & MG_F_WANT_WRITE) &&
            nc->recv_mbuf.len < nc->recv_mbuf_limit &&
            (!(nc->flags & MG_F_UDP) || nc->listener == NULL)) {
            mg_add_to_set(nc->sock, &read_set, &max_fd);
        }

        if (((nc->flags & MG_F_CONNECTING) && !(nc->flags & MG_F_WANT_READ)) ||
            (nc->send_mbuf.len > 0 && !(nc->flags & MG_F_CONNECTING))) {
            mg_add_to_set(nc->sock, &write_set, &max_fd);
            mg_add_to_set(nc->sock, &err_set, &max_fd);
        }
    }

    tv.tv_sec = milli / 1000;
    tv.tv_usec = (milli % 1000) * 1000;

    num_selected = select((int) max_fd + 1, &read_set, &write_set, &err_set, &tv);
    now = mg_time();
    DBG(("select @ %ld num_ev=%d of %d", (long) now, num_selected, num_fds));

#ifndef MG_DISABLE_SOCKETPAIR
    if (num_selected > 0 && mgr->ctl[1] != INVALID_SOCKET &&
        FD_ISSET(mgr->ctl[1], &read_set)) {
        mg_mgr_handle_ctl_sock(mgr);
    }
#endif

    for (nc = mgr->active_connections; nc != NULL; nc = tmp) {
        int fd_flags = 0;
        if (num_selected > 0) {
            fd_flags = (FD_ISSET(nc->sock, &read_set) ? _MG_F_FD_CAN_READ : 0) |
                       (FD_ISSET(nc->sock, &write_set) ? _MG_F_FD_CAN_WRITE : 0) |
                       (FD_ISSET(nc->sock, &err_set) ? _MG_F_FD_ERROR : 0);
        }
#ifdef MG_CC3200
                                                                                                                                // CC3200 does not report UDP sockets as writeable.
    if (nc->flags & MG_F_UDP &&
        (nc->send_mbuf.len > 0 || nc->flags & MG_F_CONNECTING)) {
      fd_flags |= _MG_F_FD_CAN_WRITE;
    }
#endif
#ifdef MG_LWIP
                                                                                                                                /* With LWIP socket emulation layer, we don't get write events */
    fd_flags |= _MG_F_FD_CAN_WRITE;
#endif
        tmp = nc->next;
        mg_mgr_handle_conn(nc, fd_flags, now);
    }

    for (nc = mgr->active_connections; nc != NULL; nc = tmp) {
        tmp = nc->next;
        if ((nc->flags & MG_F_CLOSE_IMMEDIATELY) ||
            (nc->send_mbuf.len == 0 && (nc->flags & MG_F_SEND_AND_CLOSE))) {
            mg_close_conn(nc);
        }
    }

    return now;
}